

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

string * __thiscall
FreeTypeFaceWrapper::NotDefGlyphName_abi_cxx11_
          (string *__return_storage_ptr__,FreeTypeFaceWrapper *this)

{
  string *this_00;
  pointer pcVar1;
  FT_UInt FVar2;
  int iVar3;
  char *pcVar4;
  FT_UInt gindex;
  uint local_44;
  string local_40;
  
  this_00 = &this->mNotDefGlyphName;
  pcVar4 = (char *)(this->mNotDefGlyphName)._M_string_length;
  if (pcVar4 == (char *)0x0) {
    if ((this->mFace->face_flags & 0x200) != 0) {
      FVar2 = FT_Get_Name_Index(this->mFace,".notdef");
      if (FVar2 == 0) {
        FT_Get_First_Char(this->mFace,&local_44);
        if (local_44 != 0) {
          GetGlyphName_abi_cxx11_(&local_40,this,local_44,true);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)this_00);
    pcVar4 = (char *)(this->mNotDefGlyphName)._M_string_length;
    if (iVar3 == 0) {
      std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar4,0x2e2ddc);
      pcVar4 = (char *)(this->mNotDefGlyphName)._M_string_length;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this_00->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar4 + (long)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FreeTypeFaceWrapper::NotDefGlyphName()
{
    // for special case of fonts that have glyph names, but don't define .notdef, use one of the existing chars (found a custom type 1 with that)
    
    if (mNotDefGlyphName.length() == 0) {
		if(FT_HAS_GLYPH_NAMES(mFace))
		{
			char* aString = (char*)".notdef";
			if(FT_Get_Name_Index(mFace,aString) == 0) {
				FT_UInt   gindex;
				FT_Get_First_Char( mFace, &gindex ); 
				if (gindex != 0)
				  mNotDefGlyphName = GetGlyphName(gindex, true);
			}
		}
		if (mNotDefGlyphName == "")  mNotDefGlyphName = ".notdef";
	}
	return mNotDefGlyphName;
}